

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall ftxui::Renderer::Impl::~Impl(Impl *this)

{
  Impl_conflict *this_local;
  
  ~Impl(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

Component Renderer(std::function<Element(bool)> render) {
  class Impl : public ComponentBase {
   public:
    Impl(std::function<Element(bool)> render) : render_(std::move(render)) {}

   private:
    Element Render() override { return render_(Focused()) | reflect(box_); }
    bool Focusable() const override { return true; }
    bool OnEvent(Event event) override {
      if (event.is_mouse() && box_.Contain(event.mouse().x, event.mouse().y)) {
        if (!CaptureMouse(event))
          return false;

        TakeFocus();
      }

      return false;
    }
    Box box_;

    std::function<Element(bool)> render_;
  };
  return Make<Impl>(std::move(render));
}